

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shortEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxId *enterId,int nr,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *max,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxabs)

{
  uint *puVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar8;
  ulong uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar2 = peVar3->s_epsilon_multiplier;
  uVar9 = -(ulong)(dVar2 == 1.0);
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,
             (double)(~uVar9 & (ulong)(dVar2 * 1e-05) | uVar9 & 0x3ee4f8b588e368f1));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar7 = ((this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver)->theRep * (enterId->super_DataKey).info;
  if (iVar7 < 0) {
    if ((max->m_backend).fpclass != cpp_dec_float_NaN) {
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168.data._M_elems[9]._1_3_ = 0;
      local_168.exp = 0;
      local_168.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&max->m_backend,&local_168);
      if (iVar7 == 0) {
        return true;
      }
    }
    pUVar8 = ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theCoPvec;
  }
  else {
    if (iVar7 == 0) {
      return false;
    }
    if ((max->m_backend).fpclass != cpp_dec_float_NaN) {
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168.data._M_elems[9]._1_3_ = 0;
      local_168.exp = 0;
      local_168.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&max->m_backend,&local_168);
      if (iVar7 == 0) {
        return true;
      }
    }
    pUVar8 = ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->thePvec;
  }
  pnVar4 = (pUVar8->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)((long)&pnVar4[nr].m_backend.data + 0x20);
  local_168.data._M_elems._32_5_ = SUB85(uVar5,0);
  local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_168.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[nr].m_backend.data;
  local_168.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[nr].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[nr].m_backend.data + 0x10);
  local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar5 = *(undefined8 *)(puVar1 + 2);
  local_168.data._M_elems._24_5_ = SUB85(uVar5,0);
  local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_168.exp = pnVar4[nr].m_backend.exp;
  local_168.neg = pnVar4[nr].m_backend.neg;
  local_168.fpclass = pnVar4[nr].m_backend.fpclass;
  local_168.prec_elem = pnVar4[nr].m_backend.prec_elem;
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  if (&local_a8 != &maxabs->m_backend) {
    uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
    local_a8.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)(maxabs->m_backend).data._M_elems;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
    local_a8.data._M_elems._16_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
    uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
    local_a8.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_a8.exp = (maxabs->m_backend).exp;
    local_a8.neg = (maxabs->m_backend).neg;
    local_a8.fpclass = (maxabs->m_backend).fpclass;
    local_a8.prec_elem = (maxabs->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_68);
  if (((local_168.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
     (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_168,&local_a8), iVar7 < 0)) {
    local_e8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
    local_e8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
    local_e8.data._M_elems[0] = local_168.data._M_elems[0];
    local_e8.data._M_elems[1] = local_168.data._M_elems[1];
    uVar5 = local_e8.data._M_elems._0_8_;
    local_e8.data._M_elems[2] = local_168.data._M_elems[2];
    local_e8.data._M_elems[3] = local_168.data._M_elems[3];
    local_e8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
    local_e8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
    local_e8.data._M_elems[4] = local_168.data._M_elems[4];
    local_e8.data._M_elems[5] = local_168.data._M_elems[5];
    local_e8.exp = local_168.exp;
    local_e8.neg = local_168.neg;
    local_e8.fpclass = local_168.fpclass;
    local_e8.prec_elem = local_168.prec_elem;
    local_e8.data._M_elems[0] = local_168.data._M_elems[0];
    if (local_168.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) {
      local_e8.neg = (bool)(local_168.neg ^ 1);
    }
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems._24_5_ = 0;
    local_128.data._M_elems[7]._1_3_ = 0;
    local_128.data._M_elems._32_5_ = 0;
    local_128.data._M_elems[9]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    if (&local_128 != &maxabs->m_backend) {
      uVar6 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
      local_128.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(maxabs->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
      uVar6 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
      local_128.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_128.exp = (maxabs->m_backend).exp;
      local_128.neg = (maxabs->m_backend).neg;
      local_128.fpclass = (maxabs->m_backend).fpclass;
      local_128.prec_elem = (maxabs->m_backend).prec_elem;
    }
    local_e8.data._M_elems._0_8_ = uVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_128,&local_68)
    ;
    if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
       (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_e8,&local_128), iVar7 < 0)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SPxFastRT<R>::shortEnter(
   const SPxId& enterId,
   int nr,
   R max,
   R maxabs) const
{
   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   if(this->thesolver->isCoId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->coPvec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }
   else if(this->thesolver->isId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->pVec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }

   return false;
}